

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderApiTests.cpp
# Opt level: O3

void deqp::gles3::Functional::anon_unknown_0::logProgram
               (TestLog *log,RenderContext *renderCtx,Program *program,ShaderAllocator *shaders)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  _Base_ptr p_Var3;
  mapped_type *ppSVar4;
  _Base_ptr p_Var5;
  int shaderTypeInt;
  key_type kVar6;
  key_type local_58 [2];
  long *local_50 [2];
  long local_40 [2];
  
  local_58[0] = CONCAT31(local_58[0]._1_3_,(program->m_info).linkOk);
  pcVar2 = (program->m_info).infoLog._M_dataplus._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar2,pcVar2 + (program->m_info).infoLog._M_string_length);
  tcu::TestLog::startShaderProgram(log,(bool)(undefined1)local_58[0],(char *)local_50[0]);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  p_Var1 = &(shaders->m_shaders)._M_t._M_impl.super__Rb_tree_header;
  kVar6 = SHADERTYPE_VERTEX;
  do {
    p_Var3 = (shaders->m_shaders)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var5 = &p_Var1->_M_header;
    if (p_Var3 != (_Base_ptr)0x0) {
      do {
        if ((int)kVar6 <= (int)*(size_t *)(p_Var3 + 1)) {
          p_Var5 = p_Var3;
        }
        p_Var3 = (&p_Var3->_M_left)[(int)*(size_t *)(p_Var3 + 1) < (int)kVar6];
      } while (p_Var3 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
         ((int)((_Rb_tree_header *)p_Var5)->_M_node_count <= (int)kVar6)) {
        local_58[0] = kVar6;
        ppSVar4 = std::
                  map<glu::ShaderType,_glu::Shader_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_glu::Shader_*>_>_>
                  ::operator[](&shaders->m_shaders,local_58);
        logShader(log,renderCtx,*ppSVar4);
      }
    }
    kVar6 = kVar6 + SHADERTYPE_FRAGMENT;
  } while (kVar6 != SHADERTYPE_LAST);
  tcu::TestLog::endShaderProgram(log);
  return;
}

Assistant:

void logProgram (TestLog& log, glu::RenderContext& renderCtx, glu::Program& program, ShaderAllocator& shaders)
{
	log << TestLog::ShaderProgram(program.getLinkStatus(), program.getInfoLog());

	for (int shaderTypeInt = 0; shaderTypeInt < glu::SHADERTYPE_LAST; shaderTypeInt++)
	{
		const glu::ShaderType shaderType = (glu::ShaderType)shaderTypeInt;

		if (shaders.hasShader(shaderType))
			logShader(log, renderCtx, shaders.get(shaderType));
	}

	log << TestLog::EndShaderProgram;
}